

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6246d::TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat::RunImpl
          (TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this)

{
  TestDetails *details;
  XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper fixtureHelper;
  undefined1 auStack_1d8 [376];
  TestReporter local_60;
  vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_> local_58;
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture((XmlTestReporterFixture *)auStack_1d8);
  local_38 = details;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper>
            ((XmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormatHelper *)auStack_1d8,
             details);
  local_60._vptr_TestReporter = (_func_int **)&PTR__DeferredTestReporter_00152c28;
  std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::~vector
            (&local_58);
  UnitTest::TestReporter::~TestReporter(&local_60);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1d8);
  std::ios_base::~ios_base((ios_base *)(auStack_1d8 + 0x70));
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleSuccessfulTestReportSummaryFormat)
{
    TestDetails const details("TestName", "DefaultSuite", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportSummary(1, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"1\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"<test suite=\"DefaultSuite\" name=\"TestName\" time=\"0\"/>"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}